

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *vQueue,Nwk_Obj_t *pObj,int iCurrent,int fArrival)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void **ppvVar7;
  long lVar8;
  int iVar9;
  void *pvVar10;
  
  uVar3 = vQueue->nSize;
  if (uVar3 == vQueue->nCap) {
    if ((int)uVar3 < 0x10) {
      if (vQueue->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vQueue->pArray,0x80);
      }
      vQueue->pArray = ppvVar7;
      vQueue->nCap = 0x10;
    }
    else {
      if (vQueue->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vQueue->pArray,(ulong)uVar3 << 4);
      }
      vQueue->pArray = ppvVar7;
      vQueue->nCap = uVar3 * 2;
    }
  }
  else {
    ppvVar7 = vQueue->pArray;
  }
  iVar4 = vQueue->nSize;
  lVar8 = (long)iVar4;
  iVar9 = iVar4 + 1;
  vQueue->nSize = iVar9;
  ppvVar7[lVar8] = pObj;
  iVar1 = iCurrent + 1;
  if (iVar1 < iVar4) {
    do {
      ppvVar7 = vQueue->pArray;
      pvVar10 = ppvVar7[(long)iVar9 + -2];
      iVar5 = *(int *)((long)pvVar10 + 0x2c);
      iVar6 = *(int *)((long)ppvVar7[lVar8] + 0x2c);
      if (fArrival == 0) {
        if (iVar6 <= iVar5) break;
      }
      else if (iVar5 <= iVar6) break;
      ppvVar7[(long)iVar9 + -2] = ppvVar7[lVar8];
      vQueue->pArray[lVar8] = pvVar10;
      lVar8 = lVar8 + -1;
      iVar9 = iVar9 + -1;
    } while (iVar1 < lVar8);
    if (iVar1 < iVar4) {
      pvVar10 = vQueue->pArray[iVar1];
      lVar8 = 1;
      do {
        piVar2 = (int *)((long)pvVar10 + 0x2c);
        pvVar10 = (vQueue->pArray + iVar1)[lVar8];
        if (fArrival == 0) {
          if (*piVar2 < *(int *)((long)pvVar10 + 0x2c)) {
            __assert_fail("Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                          ,0x223,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)"
                         );
          }
        }
        else if (*(int *)((long)pvVar10 + 0x2c) < *piVar2) {
          __assert_fail("Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                        ,0x221,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)");
        }
        lVar8 = lVar8 + 1;
      } while (iVar4 - iCurrent != (int)lVar8);
    }
  }
  return;
}

Assistant:

void Nwk_NodeUpdateAddToQueue( Vec_Ptr_t * vQueue, Nwk_Obj_t * pObj, int iCurrent, int fArrival )
{
    Nwk_Obj_t * pTemp1, * pTemp2;
    int i;
    Vec_PtrPush( vQueue, pObj );
    for ( i = Vec_PtrSize(vQueue) - 1; i > iCurrent + 1; i-- )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i-1];
        if ( fArrival )
        {
            if ( Nwk_ObjLevel(pTemp2) <= Nwk_ObjLevel(pTemp1) )
                break;
        }
        else
        {
            if ( Nwk_ObjLevel(pTemp2) >= Nwk_ObjLevel(pTemp1) )
                break;
        }
        vQueue->pArray[i-1] = pTemp1;
        vQueue->pArray[i]   = pTemp2;
    }
    // verification
    for ( i = iCurrent + 1; i < Vec_PtrSize(vQueue) - 1; i++ )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i+1];
        if ( fArrival )
            assert( Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2) );
        else
            assert( Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2) );
    }
}